

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O3

void * get_proc(char *namez)

{
  void *pvVar1;
  
  if (libGL == (void *)0x0) {
    pvVar1 = (void *)0x0;
  }
  else if ((gladGetProcAddressPtr == (PFNGLXGETPROCADDRESSPROC_PRIVATE)0x0) ||
          (pvVar1 = (*gladGetProcAddressPtr)(namez), pvVar1 == (void *)0x0)) {
    pvVar1 = (void *)dlsym(libGL,namez);
    return pvVar1;
  }
  return pvVar1;
}

Assistant:

static
void* get_proc(const char *namez) {
    void* result = NULL;
    if(libGL == NULL) return NULL;

#ifndef __APPLE__
    if(gladGetProcAddressPtr != NULL) {
        result = gladGetProcAddressPtr(namez);
    }
#endif
    if(result == NULL) {
#ifdef _WIN32
        result = (void*)GetProcAddress(libGL, namez);
#else
        result = dlsym(libGL, namez);
#endif
    }

    return result;
}